

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)

{
  kvs_header *pkVar1;
  filemgr_magic_t magic;
  avl_node *paVar2;
  bid_t offset;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  fdb_status fVar6;
  avl_node *paVar7;
  size_t sVar8;
  ulong *__ptr;
  bid_t bVar9;
  ulong uVar10;
  int iVar11;
  uint32_t uVar12;
  long lVar13;
  uint uVar14;
  docio_length doc_len;
  docio_object doc;
  docio_length local_c8;
  size_t local_b8;
  pthread_spinlock_t *local_b0;
  fdb_kvs_handle *local_a8;
  docio_handle *local_a0;
  docio_object local_98;
  char local_58 [40];
  
  local_98.length.keylen = 0;
  local_98.length.metalen = 0;
  local_98.length.bodylen = 0;
  local_98.length.bodylen_ondisk = 0;
  local_98.length.flag = '\0';
  local_98.length.checksum = '\0';
  local_98.length.reserved = 0;
  local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
  local_98.key = (void *)0x0;
  local_98.field_3.seqnum = 0;
  local_98.meta = (void *)0x0;
  local_98.body = (void *)0x0;
  local_c8.keylen = 0;
  local_c8.metalen = 0;
  local_c8.bodylen = 0;
  local_c8.bodylen_ondisk = 0;
  local_c8.flag = '\0';
  local_c8.checksum = '\0';
  local_c8.reserved = 0;
  local_a0 = handle->dhandle;
  pkVar1 = handle->file->kv_header;
  if (pkVar1 == (kvs_header *)0x0) {
    __ptr = (ulong *)0x0;
    uVar12 = 0;
  }
  else {
    magic = handle->file->version;
    local_b0 = &pkVar1->lock;
    local_a8 = handle;
    pthread_spin_lock(local_b0);
    paVar7 = avl_first(pkVar1->idx_name);
    if (paVar7 == (avl_node *)0x0) {
      local_b8 = 0x10;
      uVar10 = 0;
    }
    else {
      iVar11 = 0x10;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        sVar8 = strlen((char *)paVar7[-7].left);
        bVar3 = ver_is_atleast_magic_001(magic);
        iVar11 = (uint)bVar3 * 0x10 + (int)sVar8 + iVar11 + 0x33;
        paVar7 = avl_next(paVar7);
      } while (paVar7 != (avl_node *)0x0);
      local_b8 = (size_t)iVar11;
    }
    __ptr = (ulong *)malloc(local_b8);
    *__ptr = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
             uVar10 << 0x38;
    uVar10 = pkVar1->id_counter;
    __ptr[1] = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
               | uVar10 << 0x38;
    paVar7 = avl_first(pkVar1->idx_name);
    if (paVar7 != (avl_node *)0x0) {
      lVar13 = 0x10;
      do {
        sVar8 = strlen((char *)paVar7[-7].left);
        uVar5 = (int)sVar8 + 1;
        uVar14 = uVar5 & 0xffff;
        uVar4 = (ushort)uVar5;
        iVar11 = (int)lVar13;
        *(ushort *)((long)__ptr + (long)iVar11) = uVar4 << 8 | uVar4 >> 8;
        memcpy((void *)((long)(iVar11 + 2) + (long)__ptr),paVar7[-7].left,(ulong)uVar14);
        paVar2 = paVar7[-7].right;
        *(ulong *)((long)__ptr + (long)(int)(uVar14 + iVar11 + 2)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-6].parent;
        *(ulong *)((long)__ptr + (long)(int)(iVar11 + 10 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-3].right;
        *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x12 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-2].parent;
        *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x1a + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-2].right;
        *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x22 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-6].left;
        lVar13 = (long)(int)(uVar14 + iVar11 + 0x2a);
        *(ulong *)((long)__ptr + lVar13) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        lVar13 = lVar13 + 8;
        bVar3 = ver_is_atleast_magic_001(magic);
        if (bVar3) {
          paVar2 = paVar7[-1].right;
          *(ulong *)((long)__ptr + (long)(int)lVar13) =
               (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
               ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
               ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
          paVar2 = paVar7[-2].left;
          lVar13 = (long)(int)(uVar14 + iVar11 + 0x3a);
          *(ulong *)((long)__ptr + lVar13) =
               (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
               ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
               ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
          lVar13 = lVar13 + 8;
        }
        paVar7 = avl_next(paVar7);
      } while (paVar7 != (avl_node *)0x0);
    }
    pthread_spin_unlock(local_b0);
    uVar12 = (uint32_t)local_b8;
    handle = local_a8;
  }
  offset = handle->kv_info_offset;
  local_98.timestamp = 0;
  local_98._20_4_ = 0;
  local_98.field_3.seqnum = 0;
  local_98.length.keylen = 0;
  local_98.length.metalen = 0;
  local_98.length.bodylen = 0;
  local_98.length.bodylen_ondisk = 0;
  local_98.length.flag = '\0';
  local_98.length.checksum = '\0';
  local_98.length.reserved = 0;
  local_98.key = local_58;
  builtin_strncpy(local_58,"KV_header",10);
  local_98.meta = (void *)0x0;
  local_98.body = __ptr;
  sVar8 = strlen((char *)local_98.key);
  local_98.length.metalen = 0;
  local_98.length.keylen = (short)sVar8 + 1;
  local_98.length.bodylen = uVar12;
  local_98.field_3.seqnum = 0;
  bVar9 = docio_append_doc_system(local_a0,&local_98);
  free(__ptr);
  if (offset != 0xffffffffffffffff) {
    fVar6 = docio_read_doc_length(handle->dhandle,&local_c8,offset);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      filemgr_mark_stale(handle->file,offset,
                         (ulong)((local_c8._0_4_ & 0xffff) + ((uint)local_c8._0_4_ >> 0x10) +
                                local_c8.bodylen_ondisk) + 0x20);
    }
  }
  return bVar9;
}

Assistant:

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)
{
    char *doc_key = alca(char, 32);
    void *data;
    size_t len;
    uint64_t kv_info_offset, prev_offset;
    struct docio_object doc;
    struct docio_length doc_len;
    struct filemgr *file = handle->file;
    struct docio_handle *dhandle = handle->dhandle;

    _fdb_kvs_header_export(file->kv_header, &data, &len, file->version);

    prev_offset = handle->kv_info_offset;

    memset(&doc, 0, sizeof(struct docio_object));
    sprintf(doc_key, "KV_header");
    doc.key = (void *)doc_key;
    doc.meta = NULL;
    doc.body = data;
    doc.length.keylen = strlen(doc_key) + 1;
    doc.length.metalen = 0;
    doc.length.bodylen = len;
    doc.seqnum = 0;
    kv_info_offset = docio_append_doc_system(dhandle, &doc);
    free(data);

    if (prev_offset != BLK_NOT_FOUND) {
        if (docio_read_doc_length(handle->dhandle, &doc_len, prev_offset)
            == FDB_RESULT_SUCCESS) {
            // mark stale
            filemgr_mark_stale(handle->file, prev_offset, _fdb_get_docsize(doc_len));
        }
    }

    return kv_info_offset;
}